

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::DecimalQuantity::readLongToBcd(DecimalQuantity *this,int64_t n)

{
  int local_2c;
  ulong uStack_28;
  int i_1;
  uint64_t result;
  int64_t iStack_18;
  int i;
  int64_t n_local;
  DecimalQuantity *this_local;
  
  iStack_18 = n;
  if (n < 10000000000000000) {
    uStack_28 = 0;
    local_2c = 0x10;
    for (; iStack_18 != 0; iStack_18 = iStack_18 / 10) {
      uStack_28 = (uStack_28 >> 4) + (iStack_18 % 10 << 0x3c);
      local_2c = local_2c + -1;
    }
    (this->fBCD).bcdLong = uStack_28 >> ((byte)(local_2c << 2) & 0x3f);
    this->scale = 0;
    this->precision = 0x10 - local_2c;
  }
  else {
    ensureCapacity(this);
    result._4_4_ = 0;
    for (; iStack_18 != 0; iStack_18 = iStack_18 / 10) {
      (this->fBCD).bcdBytes.ptr[result._4_4_] = (int8_t)(iStack_18 % 10);
      result._4_4_ = result._4_4_ + 1;
    }
    this->scale = 0;
    this->precision = result._4_4_;
  }
  return;
}

Assistant:

void DecimalQuantity::readLongToBcd(int64_t n) {
    U_ASSERT(n != 0);
    if (n >= 10000000000000000L) {
        ensureCapacity();
        int i = 0;
        for (; n != 0L; n /= 10L, i++) {
            fBCD.bcdBytes.ptr[i] = static_cast<int8_t>(n % 10);
        }
        U_ASSERT(usingBytes);
        scale = 0;
        precision = i;
    } else {
        uint64_t result = 0L;
        int i = 16;
        for (; n != 0L; n /= 10L, i--) {
            result = (result >> 4) + ((n % 10) << 60);
        }
        U_ASSERT(i >= 0);
        U_ASSERT(!usingBytes);
        fBCD.bcdLong = result >> (i * 4);
        scale = 0;
        precision = 16 - i;
    }
}